

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

void append_entry(char **p,char *prefix,wchar_t type,wchar_t tag,wchar_t flags,char *name,
                 wchar_t perm,wchar_t id)

{
  char *pcVar1;
  char cVar2;
  size_t sVar3;
  int local_34;
  char *pcStack_30;
  wchar_t i;
  char *name_local;
  wchar_t flags_local;
  wchar_t tag_local;
  wchar_t type_local;
  char *prefix_local;
  char **p_local;
  
  if (prefix != (char *)0x0) {
    strcpy(*p,prefix);
    sVar3 = strlen(*p);
    *p = *p + sVar3;
  }
  pcStack_30 = name;
  if (tag != L'✑') {
    if (tag != L'✒') {
      if (tag != L'✓') {
        if (tag != L'✔') {
          if (tag == L'✕') {
            strcpy(*p,"mask");
            pcStack_30 = (char *)0x0;
            id = L'\xffffffff';
          }
          else if (tag == L'✖') {
            strcpy(*p,"other");
            pcStack_30 = (char *)0x0;
            id = L'\xffffffff';
          }
          else if (tag == L'❻') {
            strcpy(*p,"everyone@");
            pcStack_30 = (char *)0x0;
            id = L'\xffffffff';
          }
          goto LAB_001e6cf9;
        }
        pcStack_30 = (char *)0x0;
        id = L'\xffffffff';
        if ((type & 0x3c00U) != 0) {
          strcpy(*p,"group@");
          goto LAB_001e6cf9;
        }
      }
      strcpy(*p,"group");
      goto LAB_001e6cf9;
    }
    pcStack_30 = (char *)0x0;
    id = L'\xffffffff';
    if ((type & 0x3c00U) != 0) {
      strcpy(*p,"owner@");
      goto LAB_001e6cf9;
    }
  }
  strcpy(*p,"user");
LAB_001e6cf9:
  sVar3 = strlen(*p);
  *p = *p + sVar3;
  pcVar1 = *p;
  *p = pcVar1 + 1;
  *pcVar1 = ':';
  if ((((type & 0x300U) != 0) || (tag == L'✑')) || (tag == L'✓')) {
    if (pcStack_30 == (char *)0x0) {
      if (((tag == L'✑') || (tag == L'✓')) && (append_id(p,id), (type & 0x3c00U) == 0)) {
        id = L'\xffffffff';
      }
    }
    else {
      strcpy(*p,pcStack_30);
      sVar3 = strlen(*p);
      *p = *p + sVar3;
    }
    if (((flags & 4U) == 0) || ((tag != L'✖' && (tag != L'✕')))) {
      pcVar1 = *p;
      *p = pcVar1 + 1;
      *pcVar1 = ':';
    }
  }
  if ((type & 0x300U) == 0) {
    for (local_34 = 0; local_34 < 0xe; local_34 = local_34 + 1) {
      if ((perm & nfsv4_acl_perm_map[local_34].perm) == 0) {
        if ((flags & 0x10U) == 0) {
          pcVar1 = *p;
          *p = pcVar1 + 1;
          *pcVar1 = '-';
        }
      }
      else {
        cVar2 = nfsv4_acl_perm_map[local_34].c;
        pcVar1 = *p;
        *p = pcVar1 + 1;
        *pcVar1 = cVar2;
      }
    }
    pcVar1 = *p;
    *p = pcVar1 + 1;
    *pcVar1 = ':';
    for (local_34 = 0; local_34 < 7; local_34 = local_34 + 1) {
      if ((perm & nfsv4_acl_flag_map[local_34].perm) == 0) {
        if ((flags & 0x10U) == 0) {
          pcVar1 = *p;
          *p = pcVar1 + 1;
          *pcVar1 = '-';
        }
      }
      else {
        cVar2 = nfsv4_acl_flag_map[local_34].c;
        pcVar1 = *p;
        *p = pcVar1 + 1;
        *pcVar1 = cVar2;
      }
    }
    pcVar1 = *p;
    *p = pcVar1 + 1;
    *pcVar1 = ':';
    if (type == L'Ѐ') {
      strcpy(*p,"allow");
    }
    else if (type == L'ࠀ') {
      strcpy(*p,"deny");
    }
    else if (type == L'က') {
      strcpy(*p,"audit");
    }
    else if (type == L'\x2000') {
      strcpy(*p,"alarm");
    }
    sVar3 = strlen(*p);
    *p = *p + sVar3;
  }
  else {
    cVar2 = '-';
    if ((perm & 0x124U) != 0) {
      cVar2 = 'r';
    }
    pcVar1 = *p;
    *p = pcVar1 + 1;
    *pcVar1 = cVar2;
    cVar2 = '-';
    if ((perm & 0x92U) != 0) {
      cVar2 = 'w';
    }
    pcVar1 = *p;
    *p = pcVar1 + 1;
    *pcVar1 = cVar2;
    cVar2 = '-';
    if ((perm & 0x49U) != 0) {
      cVar2 = 'x';
    }
    pcVar1 = *p;
    *p = pcVar1 + 1;
    *pcVar1 = cVar2;
  }
  if (id != L'\xffffffff') {
    pcVar1 = *p;
    *p = pcVar1 + 1;
    *pcVar1 = ':';
    append_id(p,id);
  }
  return;
}

Assistant:

static void
append_entry(char **p, const char *prefix, int type,
    int tag, int flags, const char *name, int perm, int id)
{
	int i;

	if (prefix != NULL) {
		strcpy(*p, prefix);
		*p += strlen(*p);
	}
	switch (tag) {
	case ARCHIVE_ENTRY_ACL_USER_OBJ:
		name = NULL;
		id = -1;
		if ((type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) != 0) {
			strcpy(*p, "owner@");
			break;
		}
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_USER:
		strcpy(*p, "user");
		break;
	case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
		name = NULL;
		id = -1;
		if ((type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) != 0) {
			strcpy(*p, "group@");
			break;
		}
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_GROUP:
		strcpy(*p, "group");
		break;
	case ARCHIVE_ENTRY_ACL_MASK:
		strcpy(*p, "mask");
		name = NULL;
		id = -1;
		break;
	case ARCHIVE_ENTRY_ACL_OTHER:
		strcpy(*p, "other");
		name = NULL;
		id = -1;
		break;
	case ARCHIVE_ENTRY_ACL_EVERYONE:
		strcpy(*p, "everyone@");
		name = NULL;
		id = -1;
		break;
	}
	*p += strlen(*p);
	*(*p)++ = ':';
	if (((type & ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) != 0) ||
	    tag == ARCHIVE_ENTRY_ACL_USER ||
	    tag == ARCHIVE_ENTRY_ACL_GROUP) {
		if (name != NULL) {
			strcpy(*p, name);
			*p += strlen(*p);
		} else if (tag == ARCHIVE_ENTRY_ACL_USER
		    || tag == ARCHIVE_ENTRY_ACL_GROUP) {
			append_id(p, id);
			if ((type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) == 0)
				id = -1;
		}
		/* Solaris style has no second colon after other and mask */
		if (((flags & ARCHIVE_ENTRY_ACL_STYLE_SOLARIS) == 0)
		    || (tag != ARCHIVE_ENTRY_ACL_OTHER
		    && tag != ARCHIVE_ENTRY_ACL_MASK))
			*(*p)++ = ':';
	}
	if ((type & ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) != 0) {
		/* POSIX.1e ACL perms */
		*(*p)++ = (perm & 0444) ? 'r' : '-';
		*(*p)++ = (perm & 0222) ? 'w' : '-';
		*(*p)++ = (perm & 0111) ? 'x' : '-';
	} else {
		/* NFSv4 ACL perms */
		for (i = 0; i < nfsv4_acl_perm_map_size; i++) {
			if (perm & nfsv4_acl_perm_map[i].perm)
				*(*p)++ = nfsv4_acl_perm_map[i].c;
			else if ((flags & ARCHIVE_ENTRY_ACL_STYLE_COMPACT) == 0)
				*(*p)++ = '-';
		}
		*(*p)++ = ':';
		for (i = 0; i < nfsv4_acl_flag_map_size; i++) {
			if (perm & nfsv4_acl_flag_map[i].perm)
				*(*p)++ = nfsv4_acl_flag_map[i].c;
			else if ((flags & ARCHIVE_ENTRY_ACL_STYLE_COMPACT) == 0)
				*(*p)++ = '-';
		}
		*(*p)++ = ':';
		switch (type) {
		case ARCHIVE_ENTRY_ACL_TYPE_ALLOW:
			strcpy(*p, "allow");
			break;
		case ARCHIVE_ENTRY_ACL_TYPE_DENY:
			strcpy(*p, "deny");
			break;
		case ARCHIVE_ENTRY_ACL_TYPE_AUDIT:
			strcpy(*p, "audit");
			break;
		case ARCHIVE_ENTRY_ACL_TYPE_ALARM:
			strcpy(*p, "alarm");
			break;
		}
		*p += strlen(*p);
	}
	if (id != -1) {
		*(*p)++ = ':';
		append_id(p, id);
	}
}